

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_zeroing<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>>
               (void)

{
  undefined8 uVar1;
  bool bVar2;
  lazy_ostream *plVar3;
  basic_cstring<const_char> local_368;
  basic_cstring<const_char> local_358;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_348;
  assertion_result local_328;
  basic_cstring<const_char> local_310;
  basic_cstring<const_char> local_300;
  basic_cstring<const_char> local_2f0;
  basic_cstring<const_char> local_2e0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_2d0;
  assertion_result local_2b0;
  basic_cstring<const_char> local_298;
  basic_cstring<const_char> local_288;
  basic_cstring<const_char> local_278;
  basic_cstring<const_char> local_268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_258;
  assertion_result local_238;
  basic_cstring<const_char> local_220;
  basic_cstring<const_char> local_210;
  basic_cstring<const_char> local_200;
  basic_cstring<const_char> local_1f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1e0;
  assertion_result local_1c0;
  basic_cstring<const_char> local_1a8;
  basic_cstring<const_char> local_198;
  basic_cstring<const_char> local_188;
  basic_cstring<const_char> local_178;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_168;
  assertion_result local_148;
  basic_cstring<const_char> local_130;
  basic_cstring<const_char> local_120;
  basic_cstring<const_char> local_110;
  basic_cstring<const_char> local_100;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_f0;
  assertion_result local_d0;
  basic_cstring<const_char> local_b8;
  basic_cstring<const_char> local_a8 [2];
  undefined1 local_88 [8];
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  orderedBoundaries;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Base_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true>> *)
             local_88,(vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)&m.matrix_.colSettings_,5);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,local_a8,0x26d,&local_b8);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_entry((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                           *)local_88,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_d0,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_100,"!m.is_zero_entry(3, 1)",0x16);
    boost::unit_test::operator<<(&local_f0,plVar3,&local_100);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_d0,&local_f0,&local_110,0x26d,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_f0);
    boost::test_tools::assertion_result::~assertion_result(&local_d0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_120,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_130);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_120,0x26e,&local_130);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                            *)local_88,3);
    boost::test_tools::assertion_result::assertion_result(&local_148,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_178,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_168,plVar3,&local_178);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_188,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_148,&local_168,&local_188,0x26e,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_168);
    boost::test_tools::assertion_result::~assertion_result(&local_148);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::zero_entry
            ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> *
             )local_88,3,1);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_198,0x270,&local_1a8);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_entry((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                           *)local_88,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_1c0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1f0,"m.is_zero_entry(3, 1)",0x15);
    boost::unit_test::operator<<(&local_1e0,plVar3,&local_1f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1c0,&local_1e0,&local_200,0x270,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1e0);
    boost::test_tools::assertion_result::~assertion_result(&local_1c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_220);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_210,0x271,&local_220);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                            *)local_88,3);
    boost::test_tools::assertion_result::assertion_result(&local_238,(bool)(~bVar2 & 1));
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_268,"!m.is_zero_column(3)",0x14);
    boost::unit_test::operator<<(&local_258,plVar3,&local_268);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_278,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_238,&local_258,&local_278,0x271,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_258);
    boost::test_tools::assertion_result::~assertion_result(&local_238);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::zero_column
            ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> *
             )local_88,3);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_288,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_298);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_288,0x273,&local_298);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_entry((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                           *)local_88,3,1);
    boost::test_tools::assertion_result::assertion_result(&local_2b0,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2e0,"m.is_zero_entry(3, 1)",0x15);
    boost::unit_test::operator<<(&local_2d0,plVar3,&local_2e0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2f0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2b0,&local_2d0,&local_2f0,0x273,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_2d0);
    boost::test_tools::assertion_result::~assertion_result(&local_2b0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_300,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_310);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_300,0x274,&local_310);
    bVar2 = Gudhi::persistence_matrix::
            Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::
            is_zero_column((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>
                            *)local_88,3);
    boost::test_tools::assertion_result::assertion_result(&local_328,bVar2);
    plVar3 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_358,"m.is_zero_column(3)",0x13);
    boost::unit_test::operator<<(&local_348,plVar3,&local_358);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_368,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_328,&local_348,&local_368,0x274,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_348);
    boost::test_tools::assertion_result::~assertion_result(&local_328);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_>::~Matrix
            ((Matrix<Base_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true>_> *
             )local_88);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)&m.matrix_.colSettings_);
  return;
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}